

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O3

Signal<double,_int> * __thiscall
dynamicgraph::SignalPtr<double,_int>::getPtr(SignalPtr<double,_int> *this)

{
  int iVar1;
  ExceptionSignal *this_00;
  ErrorCodeEnum local_44;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = (*this->_vptr_SignalPtr[4])();
  if ((char)iVar1 != '\0') {
    return this->signalPtr;
  }
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_44 = NOT_INITIALIZED;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"In SignalPtr: SIN ptr not set.","");
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_44,(string *)local_40," (in signal <%s>)",
             *(undefined8 *)((long)&this->signalPtr + (long)this->_vptr_SignalPtr[-3]));
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

const Signal<T, Time> *SignalPtr<T, Time>::getPtr() const {
  dgTDEBUGIN(25) << SignalBase<Time>::name << "(" << isPlugged() << ")" << this
                 << "->" << signalPtr << std::endl;
  dgTDEBUGIN(25);
  if (!isPlugged()) {
    DG_THROW ExceptionSignal(ExceptionSignal::NOT_INITIALIZED,
                             "In SignalPtr: SIN ptr not set.",
                             " (in signal <%s>)", getName().c_str());
  }
  dgTDEBUGOUT(25);
  return signalPtr;
}